

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::ResourceDataValue::getStringArrayOrStringAsArray
          (ResourceDataValue *this,UnicodeString *dest,int32_t capacity,UErrorCode *errorCode)

{
  ResourceData *pResData;
  UnicodeString *this_00;
  UBool UVar1;
  int32_t iVar2;
  ConstChar16Ptr local_60;
  UChar *local_58;
  UChar *s;
  undefined1 local_48 [4];
  int32_t sLength;
  UErrorCode *local_30;
  UErrorCode *errorCode_local;
  UnicodeString *pUStack_20;
  int32_t capacity_local;
  UnicodeString *dest_local;
  ResourceDataValue *this_local;
  
  local_30 = errorCode;
  errorCode_local._4_4_ = capacity;
  pUStack_20 = dest;
  dest_local = (UnicodeString *)this;
  if ((this->res == 8) || (this->res == 9)) {
    pResData = this->pResData;
    (*(this->super_ResourceValue).super_UObject._vptr_UObject[10])(local_48,this,errorCode);
    iVar2 = anon_unknown.dwarf_2a4ed1::getStringArray
                      (pResData,(ResourceArray *)local_48,pUStack_20,errorCode_local._4_4_,local_30)
    ;
    return iVar2;
  }
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  if (pUStack_20 == (UnicodeString *)0x0) {
    if (errorCode_local._4_4_ != 0) {
LAB_003d32cc:
      *local_30 = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
  }
  else if (errorCode_local._4_4_ < 0) goto LAB_003d32cc;
  if (errorCode_local._4_4_ < 1) {
    *local_30 = U_BUFFER_OVERFLOW_ERROR;
    this_local._4_4_ = 1;
  }
  else {
    local_58 = res_getString_63(this->pResData,this->res,(int32_t *)((long)&s + 4));
    this_00 = pUStack_20;
    if (local_58 == (UChar *)0x0) {
      *local_30 = U_RESOURCE_TYPE_MISMATCH;
      this_local._4_4_ = 0;
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_60,local_58);
      UnicodeString::setTo(this_00,'\x01',&local_60,s._4_4_);
      ConstChar16Ptr::~ConstChar16Ptr(&local_60);
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t ResourceDataValue::getStringArrayOrStringAsArray(UnicodeString *dest, int32_t capacity,
                                                         UErrorCode &errorCode) const {
    if(URES_IS_ARRAY(res)) {
        return ::getStringArray(pResData, getArray(errorCode), dest, capacity, errorCode);
    }
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(dest == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(capacity < 1) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 1;
    }
    int32_t sLength;
    const UChar *s = res_getString(pResData, res, &sLength);
    if(s != NULL) {
        dest[0].setTo(TRUE, s, sLength);
        return 1;
    }
    errorCode = U_RESOURCE_TYPE_MISMATCH;
    return 0;
}